

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O1

JsrtExternalObject *
JsrtExternalObject::Create
          (void *data,uint inlineSlotSize,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype,ScriptContext *scriptContext,JsrtExternalType *type)

{
  code *pcVar1;
  type_info *ptVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  JsrtExternalObject *this;
  undefined1 local_60 [8];
  TrackAllocData data_1;
  
  ptVar2 = (type_info *)(ulong)inlineSlotSize;
  data_1._32_8_ = data;
  if (prototype == (RecyclableObject *)0x0) {
    prototype = &Js::JavascriptLibraryBase::GetObjectPrototype
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase)->super_RecyclableObject;
  }
  if (type == (JsrtExternalType *)0x0) {
    type = Js::JavascriptLibrary::GetCachedJsrtExternalType
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,0,
                      (uintptr_t)finalizeCallback,(uintptr_t)prototype);
    if (type == (JsrtExternalType *)0x0) {
      local_60 = (undefined1  [8])&JsrtExternalType::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_423e27;
      data_1.filename._0_4_ = 0x88;
      pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
      type = (JsrtExternalType *)new<Memory::Recycler>(0x48,pRVar5,0x38bbb2);
      JsrtExternalType::JsrtExternalType(type,scriptContext,finalizeCallback,prototype);
      Js::JavascriptLibrary::CacheJsrtExternalType
                ((scriptContext->super_ScriptContextBase).javascriptLibrary,0,
                 (uintptr_t)finalizeCallback,(uintptr_t)prototype,type);
    }
  }
  if (((type->super_DynamicType).super_Type.flags & TypeFlagMask_JsrtExternal) == TypeFlagMask_None)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0x91,"(type->IsJsrtExternal())","type->IsJsrtExternal()");
    if (!bVar3) goto LAB_003ba58b;
    *puVar6 = 0;
  }
  data_1.typeinfo = ptVar2;
  if (finalizeCallback == (JsFinalizeCallback)0x0) {
    local_60 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_423e27;
    data_1.filename._0_4_ = 0x9a;
    pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_003ba58b;
      *puVar6 = 0;
    }
    this = (JsrtExternalObject *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                     (pRVar5,(size_t)(ptVar2 + 0x30));
  }
  else {
    local_60 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_423e27;
    data_1.filename._0_4_ = 0x96;
    pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_003ba58b;
      *puVar6 = 0;
    }
    this = (JsrtExternalObject *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)388,false>
                     (pRVar5,(size_t)(ptVar2 + 0x30));
  }
  if (this == (JsrtExternalObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_003ba58b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  JsrtExternalObject(this,type,(void *)data_1._32_8_,inlineSlotSize);
  return this;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Create(void *data, uint inlineSlotSize, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext, JsrtExternalType * type)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }
    if (type == nullptr)
    {
#ifdef _CHAKRACOREBUILD
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(0, reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));
#else
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));
#endif

        if (type == nullptr)
        {
            type = RecyclerNew(scriptContext->GetRecycler(), JsrtExternalType, scriptContext, finalizeCallback, prototype);
#ifdef _CHAKRACOREBUILD
            scriptContext->GetLibrary()->CacheJsrtExternalType(0, reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
#else
            scriptContext->GetLibrary()->CacheJsrtExternalType(reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
#endif
        }
    }

    Assert(type->IsJsrtExternal());

    JsrtExternalObject * externalObject;
    if (finalizeCallback != nullptr)
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }

    return externalObject;
}